

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# announce_entry.hpp
# Opt level: O0

void __thiscall libtorrent::aux::announce_endpoint::~announce_endpoint(announce_endpoint *this)

{
  announce_endpoint *this_local;
  
  listen_socket_handle::~listen_socket_handle(&this->socket);
  container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
  ::~container_wrapper(&this->info_hashes);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT announce_endpoint
	{
		// internal
		announce_endpoint(aux::listen_socket_handle const& s, bool completed);

		// the local endpoint of the listen interface associated with this endpoint
		tcp::endpoint local_endpoint;

		// torrents can be announced using multiple info hashes
		// for different protocol versions

		// info_hashes[0] is the v1 info hash (SHA1)
		// info_hashes[1] is the v2 info hash (truncated SHA-256)
		aux::array<announce_infohash, num_protocols, protocol_version> info_hashes;

		// reset announce counters and clears the started sent flag.
		// The announce_endpoint will look like we've never talked to
		// the tracker.
		void reset();

		// set to false to not announce from this endpoint
		bool enabled : 1;

		// internal
		aux::listen_socket_handle socket;
	}